

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTransformFeedbackTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::TransformFeedbackTests::init
          (TransformFeedbackTests *this,EVP_PKEY_CTX *ctx)

{
  DataType DVar1;
  Interpolation interpolation;
  Precision precision_00;
  Context *pCVar2;
  DataType DVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  deUint32 dVar6;
  TestNode *pTVar7;
  TestNode *pTVar8;
  char *pcVar9;
  TestNode *pTVar10;
  TestNode *pTVar11;
  ulong extraout_RAX;
  ulong uVar12;
  int local_434;
  string local_430;
  uint local_40c;
  int local_408;
  deUint32 seed;
  int ndx;
  deUint32 primitiveType_6;
  TestCaseGroup *primitiveGroup_3;
  int primitiveTypeNdx_3;
  deUint32 bufferMode_6;
  TestCaseGroup *modeGroup_4;
  TestNode *pTStack_3e0;
  int bufferModeNdx_3;
  TestCaseGroup *randomGroup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  undefined1 local_350 [8];
  string name_5;
  int bufferMode_5;
  int primitiveType_5;
  Precision precision_3;
  int precNdx_3;
  TestCaseGroup *modeGroup_3;
  Interpolation interp;
  int modeNdx;
  TestCaseGroup *interpolationGroup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  undefined1 local_2c0 [8];
  string name_4;
  Precision precision_2;
  int precNdx_2;
  int iStack_290;
  bool isFloat_2;
  DataType type_2;
  int typeNdx_2;
  deUint32 primitiveType_4;
  TestCaseGroup *primitiveGroup_2;
  int primitiveTypeNdx_2;
  deUint32 bufferMode_4;
  TestCaseGroup *modeGroup_2;
  int bufferModeNdx_2;
  TestCaseGroup *arrayElemGroup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  undefined1 local_218 [8];
  string name_3;
  Precision precision_1;
  int precNdx_1;
  int iStack_1e8;
  bool isFloat_1;
  DataType type_1;
  int typeNdx_1;
  deUint32 primitiveType_3;
  TestCaseGroup *primitiveGroup_1;
  int primitiveTypeNdx_1;
  deUint32 bufferMode_3;
  TestCaseGroup *modeGroup_1;
  int bufferModeNdx_1;
  TestCaseGroup *arrayGroup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  undefined1 local_170 [8];
  string name_2;
  Precision precision;
  int precNdx;
  int iStack_140;
  bool isFloat;
  DataType type;
  int typeNdx;
  deUint32 primitiveType_2;
  TestCaseGroup *primitiveGroup;
  int primitiveTypeNdx;
  deUint32 bufferMode_2;
  TestCaseGroup *modeGroup;
  int bufferModeNdx;
  TestCaseGroup *basicTypeGroup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined1 local_c8 [8];
  string name_1;
  int bufferMode_1;
  int primitiveType_1;
  TestCaseGroup *pointSizeGroup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  string name;
  int local_28;
  int bufferMode;
  int primitiveType;
  TestCaseGroup *positionGroup;
  TransformFeedbackTests *this_local;
  
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"position",
             "gl_Position capture using transform feedback");
  tcu::TestNode::addChild((TestNode *)this,pTVar7);
  for (local_28 = 0; local_28 < 3; local_28 = local_28 + 1) {
    for (name.field_2._12_4_ = 0; (int)name.field_2._12_4_ < 2;
        name.field_2._12_4_ = name.field_2._12_4_ + 1) {
      pcVar9 = init::primitiveTypes[local_28].name;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,pcVar9,(allocator<char> *)((long)&pointSizeGroup + 7));
      std::operator+(&local_70,&local_90,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                     &local_70,init::bufferModes[(int)name.field_2._12_4_].name);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::allocator<char>::~allocator((allocator<char> *)((long)&pointSizeGroup + 7));
      pTVar8 = (TestNode *)operator_new(0x148);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      pcVar9 = (char *)std::__cxx11::string::c_str();
      TransformFeedback::PositionCase::PositionCase
                ((PositionCase *)pTVar8,pCVar2,pcVar9,"",
                 init::bufferModes[(int)name.field_2._12_4_].mode,
                 init::primitiveTypes[local_28].type);
      tcu::TestNode::addChild(pTVar7,pTVar8);
      std::__cxx11::string::~string((string *)local_50);
    }
  }
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"point_size",
             "gl_PointSize capture using transform feedback");
  tcu::TestNode::addChild((TestNode *)this,pTVar7);
  for (name_1.field_2._12_4_ = 0; (int)name_1.field_2._12_4_ < 3;
      name_1.field_2._12_4_ = name_1.field_2._12_4_ + 1) {
    for (name_1.field_2._8_4_ = 0; (int)name_1.field_2._8_4_ < 2;
        name_1.field_2._8_4_ = name_1.field_2._8_4_ + 1) {
      pcVar9 = init::primitiveTypes[(int)name_1.field_2._12_4_].name;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,pcVar9,(allocator<char> *)((long)&basicTypeGroup + 7));
      std::operator+(&local_e8,&local_108,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                     &local_e8,init::bufferModes[(int)name_1.field_2._8_4_].name);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_108);
      std::allocator<char>::~allocator((allocator<char> *)((long)&basicTypeGroup + 7));
      pTVar8 = (TestNode *)operator_new(0x148);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      pcVar9 = (char *)std::__cxx11::string::c_str();
      TransformFeedback::PointSizeCase::PointSizeCase
                ((PointSizeCase *)pTVar8,pCVar2,pcVar9,"",
                 init::bufferModes[(int)name_1.field_2._8_4_].mode,
                 init::primitiveTypes[(int)name_1.field_2._12_4_].type);
      tcu::TestNode::addChild(pTVar7,pTVar8);
      std::__cxx11::string::~string((string *)local_c8);
    }
  }
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"basic_types",
             "Basic types in transform feedback");
  tcu::TestNode::addChild((TestNode *)this,pTVar7);
  for (modeGroup._4_4_ = 0; modeGroup._4_4_ < 2; modeGroup._4_4_ = modeGroup._4_4_ + 1) {
    pTVar8 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar8,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::bufferModes[modeGroup._4_4_].name,"");
    dVar4 = init::bufferModes[modeGroup._4_4_].mode;
    tcu::TestNode::addChild(pTVar7,pTVar8);
    for (primitiveGroup._0_4_ = 0; (int)primitiveGroup < 3;
        primitiveGroup._0_4_ = (int)primitiveGroup + 1) {
      pTVar10 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar10,
                 (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 init::primitiveTypes[(int)primitiveGroup].name,"");
      dVar5 = init::primitiveTypes[(int)primitiveGroup].type;
      tcu::TestNode::addChild(pTVar8,pTVar10);
      for (iStack_140 = 0; iStack_140 < 0x15; iStack_140 = iStack_140 + 1) {
        DVar1 = init::basicTypes[iStack_140];
        DVar3 = glu::getDataTypeScalarType(DVar1);
        for (name_2.field_2._12_4_ = 0; (int)name_2.field_2._12_4_ < 3;
            name_2.field_2._12_4_ = name_2.field_2._12_4_ + 1) {
          name_2.field_2._8_4_ = init::precisions[(int)name_2.field_2._12_4_];
          pcVar9 = glu::getPrecisionName(name_2.field_2._8_4_);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1b0,pcVar9,(allocator<char> *)((long)&arrayGroup + 7));
          std::operator+(&local_190,&local_1b0,"_");
          pcVar9 = glu::getDataTypeName(DVar1);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_170,&local_190,pcVar9);
          std::__cxx11::string::~string((string *)&local_190);
          std::__cxx11::string::~string((string *)&local_1b0);
          std::allocator<char>::~allocator((allocator<char> *)((long)&arrayGroup + 7));
          pTVar11 = (TestNode *)operator_new(0x148);
          pCVar2 = (this->super_TestCaseGroup).m_context;
          pcVar9 = (char *)std::__cxx11::string::c_str();
          TransformFeedback::BasicTypeCase::BasicTypeCase
                    ((BasicTypeCase *)pTVar11,pCVar2,pcVar9,"",dVar4,dVar5,DVar1,
                     name_2.field_2._8_4_,(byte)~(DVar3 == TYPE_FLOAT) & INTERPOLATION_FLAT);
          tcu::TestNode::addChild(pTVar10,pTVar11);
          std::__cxx11::string::~string((string *)local_170);
        }
      }
    }
  }
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"array",
             "Capturing whole array in TF");
  tcu::TestNode::addChild((TestNode *)this,pTVar7);
  for (modeGroup_1._4_4_ = 0; modeGroup_1._4_4_ < 2; modeGroup_1._4_4_ = modeGroup_1._4_4_ + 1) {
    pTVar8 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar8,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::bufferModes[modeGroup_1._4_4_].name,"");
    dVar4 = init::bufferModes[modeGroup_1._4_4_].mode;
    tcu::TestNode::addChild(pTVar7,pTVar8);
    for (primitiveGroup_1._0_4_ = 0; (int)primitiveGroup_1 < 3;
        primitiveGroup_1._0_4_ = (int)primitiveGroup_1 + 1) {
      pTVar10 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar10,
                 (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 init::primitiveTypes[(int)primitiveGroup_1].name,"");
      dVar5 = init::primitiveTypes[(int)primitiveGroup_1].type;
      tcu::TestNode::addChild(pTVar8,pTVar10);
      for (iStack_1e8 = 0; iStack_1e8 < 0x15; iStack_1e8 = iStack_1e8 + 1) {
        DVar1 = init::basicTypes[iStack_1e8];
        DVar3 = glu::getDataTypeScalarType(DVar1);
        for (name_3.field_2._12_4_ = 0; (int)name_3.field_2._12_4_ < 3;
            name_3.field_2._12_4_ = name_3.field_2._12_4_ + 1) {
          name_3.field_2._8_4_ = init::precisions[(int)name_3.field_2._12_4_];
          pcVar9 = glu::getPrecisionName(name_3.field_2._8_4_);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_258,pcVar9,(allocator<char> *)((long)&arrayElemGroup + 7));
          std::operator+(&local_238,&local_258,"_");
          pcVar9 = glu::getDataTypeName(DVar1);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_218,&local_238,pcVar9);
          std::__cxx11::string::~string((string *)&local_238);
          std::__cxx11::string::~string((string *)&local_258);
          std::allocator<char>::~allocator((allocator<char> *)((long)&arrayElemGroup + 7));
          pTVar11 = (TestNode *)operator_new(0x148);
          pCVar2 = (this->super_TestCaseGroup).m_context;
          pcVar9 = (char *)std::__cxx11::string::c_str();
          TransformFeedback::BasicArrayCase::BasicArrayCase
                    ((BasicArrayCase *)pTVar11,pCVar2,pcVar9,"",dVar4,dVar5,DVar1,
                     name_3.field_2._8_4_,(byte)~(DVar3 == TYPE_FLOAT) & INTERPOLATION_FLAT);
          tcu::TestNode::addChild(pTVar10,pTVar11);
          std::__cxx11::string::~string((string *)local_218);
        }
      }
    }
  }
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "array_element","Capturing single array element in TF");
  tcu::TestNode::addChild((TestNode *)this,pTVar7);
  for (modeGroup_2._4_4_ = 0; modeGroup_2._4_4_ < 2; modeGroup_2._4_4_ = modeGroup_2._4_4_ + 1) {
    pTVar8 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar8,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::bufferModes[modeGroup_2._4_4_].name,"");
    dVar4 = init::bufferModes[modeGroup_2._4_4_].mode;
    tcu::TestNode::addChild(pTVar7,pTVar8);
    for (primitiveGroup_2._0_4_ = 0; (int)primitiveGroup_2 < 3;
        primitiveGroup_2._0_4_ = (int)primitiveGroup_2 + 1) {
      pTVar10 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar10,
                 (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 init::primitiveTypes[(int)primitiveGroup_2].name,"");
      dVar5 = init::primitiveTypes[(int)primitiveGroup_2].type;
      tcu::TestNode::addChild(pTVar8,pTVar10);
      for (iStack_290 = 0; iStack_290 < 0x15; iStack_290 = iStack_290 + 1) {
        DVar1 = init::basicTypes[iStack_290];
        DVar3 = glu::getDataTypeScalarType(DVar1);
        for (name_4.field_2._12_4_ = 0; (int)name_4.field_2._12_4_ < 3;
            name_4.field_2._12_4_ = name_4.field_2._12_4_ + 1) {
          name_4.field_2._8_4_ = init::precisions[(int)name_4.field_2._12_4_];
          pcVar9 = glu::getPrecisionName(name_4.field_2._8_4_);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_300,pcVar9,(allocator<char> *)((long)&interpolationGroup + 7))
          ;
          std::operator+(&local_2e0,&local_300,"_");
          pcVar9 = glu::getDataTypeName(DVar1);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2c0,&local_2e0,pcVar9);
          std::__cxx11::string::~string((string *)&local_2e0);
          std::__cxx11::string::~string((string *)&local_300);
          std::allocator<char>::~allocator((allocator<char> *)((long)&interpolationGroup + 7));
          pTVar11 = (TestNode *)operator_new(0x148);
          pCVar2 = (this->super_TestCaseGroup).m_context;
          pcVar9 = (char *)std::__cxx11::string::c_str();
          TransformFeedback::ArrayElementCase::ArrayElementCase
                    ((ArrayElementCase *)pTVar11,pCVar2,pcVar9,"",dVar4,dVar5,DVar1,
                     name_4.field_2._8_4_,(byte)~(DVar3 == TYPE_FLOAT) & INTERPOLATION_FLAT);
          tcu::TestNode::addChild(pTVar10,pTVar11);
          std::__cxx11::string::~string((string *)local_2c0);
        }
      }
    }
  }
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "interpolation","Different interpolation modes in transform feedback varyings");
  tcu::TestNode::addChild((TestNode *)this,pTVar7);
  for (modeGroup_3._4_4_ = 0; modeGroup_3._4_4_ < 3; modeGroup_3._4_4_ = modeGroup_3._4_4_ + 1) {
    interpolation = init::interpModes[modeGroup_3._4_4_].interp;
    pTVar8 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar8,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::interpModes[modeGroup_3._4_4_].name,"");
    tcu::TestNode::addChild(pTVar7,pTVar8);
    for (primitiveType_5 = 0; primitiveType_5 < 3; primitiveType_5 = primitiveType_5 + 1) {
      precision_00 = init::precisions[primitiveType_5];
      for (name_5.field_2._12_4_ = 0; (int)name_5.field_2._12_4_ < 3;
          name_5.field_2._12_4_ = name_5.field_2._12_4_ + 1) {
        for (name_5.field_2._8_4_ = 0; (int)name_5.field_2._8_4_ < 2;
            name_5.field_2._8_4_ = name_5.field_2._8_4_ + 1) {
          pcVar9 = glu::getPrecisionName(precision_00);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3d0,pcVar9,(allocator<char> *)((long)&randomGroup + 7));
          std::operator+(&local_3b0,&local_3d0,"_vec4_");
          std::operator+(&local_390,&local_3b0,init::primitiveTypes[(int)name_5.field_2._12_4_].name
                        );
          std::operator+(&local_370,&local_390,"_");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_350,&local_370,init::bufferModes[(int)name_5.field_2._8_4_].name);
          std::__cxx11::string::~string((string *)&local_370);
          std::__cxx11::string::~string((string *)&local_390);
          std::__cxx11::string::~string((string *)&local_3b0);
          std::__cxx11::string::~string((string *)&local_3d0);
          std::allocator<char>::~allocator((allocator<char> *)((long)&randomGroup + 7));
          pTVar10 = (TestNode *)operator_new(0x148);
          pCVar2 = (this->super_TestCaseGroup).m_context;
          pcVar9 = (char *)std::__cxx11::string::c_str();
          TransformFeedback::BasicTypeCase::BasicTypeCase
                    ((BasicTypeCase *)pTVar10,pCVar2,pcVar9,"",
                     init::bufferModes[(int)name_5.field_2._8_4_].mode,
                     init::primitiveTypes[(int)name_5.field_2._12_4_].type,TYPE_FLOAT_VEC4,
                     precision_00,interpolation);
          tcu::TestNode::addChild(pTVar8,pTVar10);
          std::__cxx11::string::~string((string *)local_350);
        }
      }
    }
  }
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"random",
             "Randomized transform feedback cases");
  pTStack_3e0 = pTVar7;
  tcu::TestNode::addChild((TestNode *)this,pTVar7);
  modeGroup_4._4_4_ = 0;
  uVar12 = extraout_RAX;
  while ((int)modeGroup_4._4_4_ < 2) {
    pTVar7 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar7,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::bufferModes[(int)modeGroup_4._4_4_].name,"");
    primitiveGroup_3._4_4_ = init::bufferModes[(int)modeGroup_4._4_4_].mode;
    _primitiveTypeNdx_3 = pTVar7;
    tcu::TestNode::addChild(pTStack_3e0,pTVar7);
    for (primitiveGroup_3._0_4_ = 0; (int)primitiveGroup_3 < 3;
        primitiveGroup_3._0_4_ = (int)primitiveGroup_3 + 1) {
      pTVar7 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar7,
                 (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 init::primitiveTypes[(int)primitiveGroup_3].name,"");
      seed = init::primitiveTypes[(int)primitiveGroup_3].type;
      _ndx = pTVar7;
      tcu::TestNode::addChild(_primitiveTypeNdx_3,pTVar7);
      for (local_408 = 0; local_408 < 10; local_408 = local_408 + 1) {
        dVar4 = ::deInt32Hash(primitiveGroup_3._4_4_);
        dVar5 = ::deInt32Hash(seed);
        dVar6 = ::deInt32Hash(local_408);
        pTVar7 = _ndx;
        local_40c = dVar4 ^ dVar5 ^ dVar6;
        pTVar8 = (TestNode *)operator_new(0x148);
        pCVar2 = (this->super_TestCaseGroup).m_context;
        local_434 = local_408 + 1;
        de::toString<int>(&local_430,&local_434);
        pcVar9 = (char *)std::__cxx11::string::c_str();
        TransformFeedback::RandomCase::RandomCase
                  ((RandomCase *)pTVar8,pCVar2,pcVar9,"",primitiveGroup_3._4_4_,seed,local_40c);
        tcu::TestNode::addChild(pTVar7,pTVar8);
        std::__cxx11::string::~string((string *)&local_430);
      }
    }
    modeGroup_4._4_4_ = modeGroup_4._4_4_ + 1;
    uVar12 = (ulong)modeGroup_4._4_4_;
  }
  return (int)uVar12;
}

Assistant:

void TransformFeedbackTests::init (void)
{
	static const struct
	{
		const char*		name;
		deUint32		mode;
	} bufferModes[] =
	{
		{ "separate",		GL_SEPARATE_ATTRIBS		},
		{ "interleaved",	GL_INTERLEAVED_ATTRIBS	}
	};

	static const struct
	{
		const char*		name;
		deUint32		type;
	} primitiveTypes[] =
	{
		{ "points",			GL_POINTS			},
		{ "lines",			GL_LINES			},
		{ "triangles",		GL_TRIANGLES		}

		// Not supported by GLES3.
//		{ "line_strip",		GL_LINE_STRIP		},
//		{ "line_loop",		GL_LINE_LOOP		},
//		{ "triangle_fan",	GL_TRIANGLE_FAN		},
//		{ "triangle_strip",	GL_TRIANGLE_STRIP	}
	};

	static const glu::DataType basicTypes[] =
	{
		glu::TYPE_FLOAT,
		glu::TYPE_FLOAT_VEC2,
		glu::TYPE_FLOAT_VEC3,
		glu::TYPE_FLOAT_VEC4,
		glu::TYPE_FLOAT_MAT2,
		glu::TYPE_FLOAT_MAT2X3,
		glu::TYPE_FLOAT_MAT2X4,
		glu::TYPE_FLOAT_MAT3X2,
		glu::TYPE_FLOAT_MAT3,
		glu::TYPE_FLOAT_MAT3X4,
		glu::TYPE_FLOAT_MAT4X2,
		glu::TYPE_FLOAT_MAT4X3,
		glu::TYPE_FLOAT_MAT4,
		glu::TYPE_INT,
		glu::TYPE_INT_VEC2,
		glu::TYPE_INT_VEC3,
		glu::TYPE_INT_VEC4,
		glu::TYPE_UINT,
		glu::TYPE_UINT_VEC2,
		glu::TYPE_UINT_VEC3,
		glu::TYPE_UINT_VEC4
	};

	static const glu::Precision precisions[] =
	{
		glu::PRECISION_LOWP,
		glu::PRECISION_MEDIUMP,
		glu::PRECISION_HIGHP
	};

	static const struct
	{
		const char*		name;
		Interpolation	interp;
	} interpModes[] =
	{
		{ "smooth",		INTERPOLATION_SMOOTH	},
		{ "flat",		INTERPOLATION_FLAT		},
		{ "centroid",	INTERPOLATION_CENTROID	}
	};

	// .position
	{
		tcu::TestCaseGroup* positionGroup = new tcu::TestCaseGroup(m_testCtx, "position", "gl_Position capture using transform feedback");
		addChild(positionGroup);

		for (int primitiveType = 0; primitiveType < DE_LENGTH_OF_ARRAY(primitiveTypes); primitiveType++)
		{
			for (int bufferMode = 0; bufferMode < DE_LENGTH_OF_ARRAY(bufferModes); bufferMode++)
			{
				string name = string(primitiveTypes[primitiveType].name) + "_" + bufferModes[bufferMode].name;
				positionGroup->addChild(new PositionCase(m_context, name.c_str(), "", bufferModes[bufferMode].mode, primitiveTypes[primitiveType].type));
			}
		}
	}

	// .point_size
	{
		tcu::TestCaseGroup* pointSizeGroup = new tcu::TestCaseGroup(m_testCtx, "point_size", "gl_PointSize capture using transform feedback");
		addChild(pointSizeGroup);

		for (int primitiveType = 0; primitiveType < DE_LENGTH_OF_ARRAY(primitiveTypes); primitiveType++)
		{
			for (int bufferMode = 0; bufferMode < DE_LENGTH_OF_ARRAY(bufferModes); bufferMode++)
			{
				string name = string(primitiveTypes[primitiveType].name) + "_" + bufferModes[bufferMode].name;
				pointSizeGroup->addChild(new PointSizeCase(m_context, name.c_str(), "", bufferModes[bufferMode].mode, primitiveTypes[primitiveType].type));
			}
		}
	}

	// .basic_type
	{
		tcu::TestCaseGroup* basicTypeGroup = new tcu::TestCaseGroup(m_testCtx, "basic_types", "Basic types in transform feedback");
		addChild(basicTypeGroup);

		for (int bufferModeNdx = 0; bufferModeNdx < DE_LENGTH_OF_ARRAY(bufferModes); bufferModeNdx++)
		{
			tcu::TestCaseGroup* modeGroup	= new tcu::TestCaseGroup(m_testCtx, bufferModes[bufferModeNdx].name, "");
			deUint32			bufferMode	= bufferModes[bufferModeNdx].mode;
			basicTypeGroup->addChild(modeGroup);

			for (int primitiveTypeNdx = 0; primitiveTypeNdx < DE_LENGTH_OF_ARRAY(primitiveTypes); primitiveTypeNdx++)
			{
				tcu::TestCaseGroup* primitiveGroup	= new tcu::TestCaseGroup(m_testCtx, primitiveTypes[primitiveTypeNdx].name, "");
				deUint32			primitiveType	= primitiveTypes[primitiveTypeNdx].type;
				modeGroup->addChild(primitiveGroup);

				for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(basicTypes); typeNdx++)
				{
					glu::DataType		type		= basicTypes[typeNdx];
					bool				isFloat		= glu::getDataTypeScalarType(type) == glu::TYPE_FLOAT;

					for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
					{
						glu::Precision precision = precisions[precNdx];

						string name = string(glu::getPrecisionName(precision)) + "_" + glu::getDataTypeName(type);
						primitiveGroup->addChild(new BasicTypeCase(m_context, name.c_str(), "", bufferMode, primitiveType, type, precision, isFloat ? INTERPOLATION_SMOOTH : INTERPOLATION_FLAT));
					}
				}
			}
		}
	}

	// .array
	{
		tcu::TestCaseGroup* arrayGroup = new tcu::TestCaseGroup(m_testCtx, "array", "Capturing whole array in TF");
		addChild(arrayGroup);

		for (int bufferModeNdx = 0; bufferModeNdx < DE_LENGTH_OF_ARRAY(bufferModes); bufferModeNdx++)
		{
			tcu::TestCaseGroup* modeGroup	= new tcu::TestCaseGroup(m_testCtx, bufferModes[bufferModeNdx].name, "");
			deUint32			bufferMode	= bufferModes[bufferModeNdx].mode;
			arrayGroup->addChild(modeGroup);

			for (int primitiveTypeNdx = 0; primitiveTypeNdx < DE_LENGTH_OF_ARRAY(primitiveTypes); primitiveTypeNdx++)
			{
				tcu::TestCaseGroup* primitiveGroup	= new tcu::TestCaseGroup(m_testCtx, primitiveTypes[primitiveTypeNdx].name, "");
				deUint32			primitiveType	= primitiveTypes[primitiveTypeNdx].type;
				modeGroup->addChild(primitiveGroup);

				for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(basicTypes); typeNdx++)
				{
					glu::DataType		type		= basicTypes[typeNdx];
					bool				isFloat		= glu::getDataTypeScalarType(type) == glu::TYPE_FLOAT;

					for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
					{
						glu::Precision precision = precisions[precNdx];

						string name = string(glu::getPrecisionName(precision)) + "_" + glu::getDataTypeName(type);
						primitiveGroup->addChild(new BasicArrayCase(m_context, name.c_str(), "", bufferMode, primitiveType, type, precision, isFloat ? INTERPOLATION_SMOOTH : INTERPOLATION_FLAT));
					}
				}
			}
		}
	}

	// .array_element
	{
		tcu::TestCaseGroup* arrayElemGroup = new tcu::TestCaseGroup(m_testCtx, "array_element", "Capturing single array element in TF");
		addChild(arrayElemGroup);

		for (int bufferModeNdx = 0; bufferModeNdx < DE_LENGTH_OF_ARRAY(bufferModes); bufferModeNdx++)
		{
			tcu::TestCaseGroup* modeGroup	= new tcu::TestCaseGroup(m_testCtx, bufferModes[bufferModeNdx].name, "");
			deUint32			bufferMode	= bufferModes[bufferModeNdx].mode;
			arrayElemGroup->addChild(modeGroup);

			for (int primitiveTypeNdx = 0; primitiveTypeNdx < DE_LENGTH_OF_ARRAY(primitiveTypes); primitiveTypeNdx++)
			{
				tcu::TestCaseGroup* primitiveGroup	= new tcu::TestCaseGroup(m_testCtx, primitiveTypes[primitiveTypeNdx].name, "");
				deUint32			primitiveType	= primitiveTypes[primitiveTypeNdx].type;
				modeGroup->addChild(primitiveGroup);

				for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(basicTypes); typeNdx++)
				{
					glu::DataType		type		= basicTypes[typeNdx];
					bool				isFloat		= glu::getDataTypeScalarType(type) == glu::TYPE_FLOAT;

					for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
					{
						glu::Precision precision = precisions[precNdx];

						string name = string(glu::getPrecisionName(precision)) + "_" + glu::getDataTypeName(type);
						primitiveGroup->addChild(new ArrayElementCase(m_context, name.c_str(), "", bufferMode, primitiveType, type, precision, isFloat ? INTERPOLATION_SMOOTH : INTERPOLATION_FLAT));
					}
				}
			}
		}
	}

	// .interpolation
	{
		tcu::TestCaseGroup* interpolationGroup = new tcu::TestCaseGroup(m_testCtx, "interpolation", "Different interpolation modes in transform feedback varyings");
		addChild(interpolationGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(interpModes); modeNdx++)
		{
			Interpolation		interp		= interpModes[modeNdx].interp;
			tcu::TestCaseGroup*	modeGroup	= new tcu::TestCaseGroup(m_testCtx, interpModes[modeNdx].name, "");

			interpolationGroup->addChild(modeGroup);

			for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
			{
				glu::Precision precision = precisions[precNdx];

				for (int primitiveType = 0; primitiveType < DE_LENGTH_OF_ARRAY(primitiveTypes); primitiveType++)
				{
					for (int bufferMode = 0; bufferMode < DE_LENGTH_OF_ARRAY(bufferModes); bufferMode++)
					{
						string name = string(glu::getPrecisionName(precision)) + "_vec4_" + primitiveTypes[primitiveType].name + "_" + bufferModes[bufferMode].name;
						modeGroup->addChild(new BasicTypeCase(m_context, name.c_str(), "", bufferModes[bufferMode].mode, primitiveTypes[primitiveType].type, glu::TYPE_FLOAT_VEC4, precision, interp));
					}
				}
			}
		}
	}

	// .random
	{
		tcu::TestCaseGroup* randomGroup = new tcu::TestCaseGroup(m_testCtx, "random", "Randomized transform feedback cases");
		addChild(randomGroup);

		for (int bufferModeNdx = 0; bufferModeNdx < DE_LENGTH_OF_ARRAY(bufferModes); bufferModeNdx++)
		{
			tcu::TestCaseGroup* modeGroup	= new tcu::TestCaseGroup(m_testCtx, bufferModes[bufferModeNdx].name, "");
			deUint32			bufferMode	= bufferModes[bufferModeNdx].mode;
			randomGroup->addChild(modeGroup);

			for (int primitiveTypeNdx = 0; primitiveTypeNdx < DE_LENGTH_OF_ARRAY(primitiveTypes); primitiveTypeNdx++)
			{
				tcu::TestCaseGroup* primitiveGroup	= new tcu::TestCaseGroup(m_testCtx, primitiveTypes[primitiveTypeNdx].name, "");
				deUint32			primitiveType	= primitiveTypes[primitiveTypeNdx].type;
				modeGroup->addChild(primitiveGroup);

				for (int ndx = 0; ndx < 10; ndx++)
				{
					deUint32 seed = deInt32Hash(bufferMode) ^ deInt32Hash(primitiveType) ^ deInt32Hash(ndx);
					primitiveGroup->addChild(new RandomCase(m_context, de::toString(ndx+1).c_str(), "", bufferMode, primitiveType, seed));
				}
			}
		}
	}
}